

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLinearSampleResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               int coordZ,Vec4 *result)

{
  int size;
  int size_00;
  int c;
  bool bVar1;
  TextureChannelClass TVar2;
  int iVar3;
  int x1;
  int y0;
  int y1;
  int c_00;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float local_12c;
  Vec2 local_a8;
  Vec2 local_a0;
  Vec2 vBounds;
  Vec2 uBounds;
  ColorQuad quad;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar4 = floorf(uBounds.m_data[0] + -0.5);
  fVar5 = floorf(uBounds.m_data[1] + -0.5);
  fVar6 = floorf(vBounds.m_data[0] + -0.5);
  fVar7 = floorf(vBounds.m_data[1] + -0.5);
  size = (level->m_size).m_data[0];
  size_00 = (level->m_size).m_data[1];
  TVar2 = getTextureChannelClass((level->m_format).type);
  if (TVar2 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
    local_12c = computeBilinearSearchStepForSnorm(prec);
  }
  else {
    local_12c = 0.0;
    if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_12c = computeBilinearSearchStepForUnorm(prec);
    }
  }
  iVar3 = (int)fVar6;
  while (c = iVar3, c <= (int)fVar7) {
    fVar6 = (float)c;
    c_00 = (int)fVar4;
    while (iVar3 = c + 1, c_00 <= (int)fVar5) {
      iVar3 = TexVerifierUtil::wrap(sampler->wrapS,c_00,size);
      x1 = TexVerifierUtil::wrap(sampler->wrapS,c_00 + 1,size);
      y0 = TexVerifierUtil::wrap(sampler->wrapT,c,size_00);
      y1 = TexVerifierUtil::wrap(sampler->wrapT,c + 1,size_00);
      fVar12 = uBounds.m_data[1];
      fVar11 = uBounds.m_data[0];
      fVar14 = vBounds.m_data[1];
      fVar13 = vBounds.m_data[0];
      ColorQuad::ColorQuad(&quad);
      lookupQuad(&quad,level,sampler,iVar3,x1,y0,y1,coordZ);
      if (TVar2 == TEXTURECHANNELCLASS_FLOATING_POINT) {
        local_12c = computeBilinearSearchStepFromFloatQuad(prec,&quad);
      }
      fVar8 = (float)c_00;
      fVar11 = (fVar11 + -0.5) - fVar8;
      fVar12 = (fVar12 + -0.5) - fVar8;
      auVar9._4_4_ = fVar12;
      auVar9._0_4_ = fVar11;
      auVar9._8_4_ = 0.0 - fVar8;
      auVar9._12_4_ = 0.0 - fVar8;
      auVar9 = minps(_DAT_00963870,auVar9);
      fVar13 = (fVar13 + -0.5) - fVar6;
      fVar14 = (fVar14 + -0.5) - fVar6;
      auVar10._4_4_ = fVar14;
      auVar10._0_4_ = fVar13;
      auVar10._8_4_ = 0.0 - fVar6;
      auVar10._12_4_ = 0.0 - fVar6;
      auVar10 = minps(_DAT_00963870,auVar10);
      local_a0.m_data[1] = (float)(-(uint)(0.0 <= fVar12) & auVar9._4_4_);
      local_a0.m_data[0] = (float)(-(uint)(0.0 <= fVar11) & auVar9._0_4_);
      local_a8.m_data[1] = (float)(-(uint)(0.0 <= fVar14) & auVar10._4_4_);
      local_a8.m_data[0] = (float)(-(uint)(0.0 <= fVar13) & auVar10._0_4_);
      bVar1 = isBilinearRangeValid(prec,&quad,&local_a0,&local_a8,local_12c,result);
      c_00 = c_00 + 1;
      if (bVar1) goto LAB_009306ed;
    }
  }
LAB_009306ed:
  return c <= (int)fVar7;
}

Assistant:

bool isLinearSampleResultValid (const ConstPixelBufferAccess&		level,
								const Sampler&						sampler,
								const LookupPrecision&				prec,
								const Vec2&							coord,
								const int							coordZ,
								const Vec4&							result)
{
	const Vec2					uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					vBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0,y0) - without wrap mode
	const int					minI			= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int					maxI			= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int					minJ			= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int					maxJ			= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int					w				= level.getWidth();
	const int					h				= level.getHeight();

	const TextureChannelClass	texClass		= getTextureChannelClass(level.getFormat().type);
	float						searchStep		= texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	? computeBilinearSearchStepForUnorm(prec) :
												  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	? computeBilinearSearchStepForSnorm(prec) :
												  0.0f; // Step is computed for floating-point quads based on texel values.

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			// Wrapped coordinates
			const int	x0		= wrap(sampler.wrapS, i  , w);
			const int	x1		= wrap(sampler.wrapS, i+1, w);
			const int	y0		= wrap(sampler.wrapT, j  , h);
			const int	y1		= wrap(sampler.wrapT, j+1, h);

			// Bounds for filtering factors
			const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
			const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);
			const float	minB	= de::clamp((vBounds.x()-0.5f)-float(j), 0.0f, 1.0f);
			const float	maxB	= de::clamp((vBounds.y()-0.5f)-float(j), 0.0f, 1.0f);

			ColorQuad quad;
			lookupQuad(quad, level, sampler, x0, x1, y0, y1, coordZ);

			if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
				searchStep = computeBilinearSearchStepFromFloatQuad(prec, quad);

			if (isBilinearRangeValid(prec, quad, Vec2(minA, maxA), Vec2(minB, maxB), searchStep, result))
				return true;
		}
	}

	return false;
}